

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

Tree * __thiscall obx::Tree::getLeafName(Tree *this,string *path)

{
  string *in_RDX;
  string local_60 [48];
  long local_30;
  size_type lastDelimiter;
  string *local_20;
  string *path_local;
  Tree *this_local;
  string *leafName;
  
  lastDelimiter._7_1_ = 0;
  local_20 = in_RDX;
  path_local = path;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  local_30 = std::__cxx11::string::find_last_of((char)local_20,(ulong)(uint)(int)(char)path[8]);
  if (local_30 == -1) {
    std::__cxx11::string::operator=((string *)this,local_20);
  }
  else {
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_20);
    std::__cxx11::string::operator=((string *)this,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return this;
}

Assistant:

std::string Tree::getLeafName(const std::string& path) const {
    std::string leafName;
    auto lastDelimiter = path.find_last_of(pathDelimiter_);
    if (lastDelimiter == std::string ::npos) {
        leafName = path;
    } else {
        leafName = path.substr(lastDelimiter + 1);
    }
    return leafName;
}